

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

size_t __thiscall
GF2::MI<8UL,_GF2::MOGrevlex<8UL>_>::GatherMinLMons
          (MI<8UL,_GF2::MOGrevlex<8UL>_> *this,MP<8UL,_GF2::MOGrevlex<8UL>_> *polyMons)

{
  const_iterator __position;
  _List_node_base *p_Var1;
  
  GatherLMons(this,polyMons);
  __position._M_node =
       (polyMons->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
       super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
       super__List_node_base._M_next;
  do {
    p_Var1 = (_List_node_base *)polyMons;
    if (__position._M_node == (_List_node_base *)polyMons) {
      return (polyMons->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
             super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node._M_size;
    }
    do {
      p_Var1 = p_Var1->_M_prev;
      if (p_Var1 == __position._M_node) goto LAB_00144318;
    } while (((ulong)p_Var1[1]._M_next & ~(ulong)__position._M_node[1]._M_next) != 0);
    if (p_Var1 == __position._M_node) {
LAB_00144318:
      __position._M_node = (__position._M_node)->_M_next;
    }
    else {
      __position._M_node =
           (_List_node_base *)
           std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
                     (&polyMons->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,__position
                     );
    }
  } while( true );
}

Assistant:

size_t GatherMinLMons(MP<_n, _O>& polyMons) const
	{
		GatherLMons(polyMons);
		// от старших мономов к младшим
		for (auto iter = polyMons.begin(); iter != polyMons.end();)
		{
			// от младших мономов к старшим
			auto iter1 = --polyMons.end();
			for (; iter1 != iter; --iter1)
				if (*iter1 | *iter)
					break;
			if (iter1 == iter) 
				++iter;
			else 
				iter = polyMons.erase(iter);
		}
		return polyMons.Size();
	}